

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronous_factory.h
# Opt level: O0

shared_ptr<spdlog::logger>
spdlog::synchronous_factory::
create<spdlog::sinks::basic_file_sink<std::mutex>,std::__cxx11::string_const&,bool&,spdlog::file_event_handlers_const&>
          (string *logger_name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,bool *args_1,
          file_event_handlers *args_2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>_> *in_RSI;
  element_type *in_RDI;
  shared_ptr<spdlog::logger> sVar1;
  shared_ptr<spdlog::logger> *in_stack_00000018;
  registry *in_stack_00000020;
  shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>_> sink;
  shared_ptr<spdlog::logger> *new_logger;
  shared_ptr<spdlog::logger> *in_stack_ffffffffffffff68;
  file_event_handlers *__args_2;
  element_type *in_stack_ffffffffffffffa0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffa8;
  
  __args_2 = (file_event_handlers *)&stack0xffffffffffffffc8;
  std::
  make_shared<spdlog::sinks::basic_file_sink<std::mutex>,std::__cxx11::string_const&,bool&,spdlog::file_event_handlers_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa8._M_pi,(bool *)in_stack_ffffffffffffffa0,__args_2);
  std::
  make_shared<spdlog::logger,std::__cxx11::string,std::shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_2,in_RSI);
  details::registry::instance();
  CLI::std::shared_ptr<spdlog::logger>::shared_ptr
            ((shared_ptr<spdlog::logger> *)&stack0xffffffffffffffa0,in_stack_ffffffffffffff68);
  details::registry::initialize_logger(in_stack_00000020,in_stack_00000018);
  CLI::std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x6a67c2);
  CLI::std::shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>_>::~shared_ptr
            ((shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>_> *)0x6a681e);
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<spdlog::logger> create(std::string logger_name, SinkArgs &&...args) {
        auto sink = std::make_shared<Sink>(std::forward<SinkArgs>(args)...);
        auto new_logger = std::make_shared<spdlog::logger>(std::move(logger_name), std::move(sink));
        details::registry::instance().initialize_logger(new_logger);
        return new_logger;
    }